

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O0

int beagleUpdatePrePartials
              (int instance,BeagleOperation *operations,int operationCount,
              int cumulativeScalingIndex)

{
  BeagleImpl *pBVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  int returnValue;
  BeagleImpl *beagleInstance;
  int in_stack_ffffffffffffffdc;
  undefined4 local_4;
  
  pBVar1 = beagle::getBeagleInstance(in_stack_ffffffffffffffdc);
  if (pBVar1 == (BeagleImpl *)0x0) {
    local_4 = -4;
  }
  else {
    local_4 = (**(code **)(*(long *)pBVar1 + 0xe0))(pBVar1,in_RSI,in_EDX,in_ECX);
  }
  return local_4;
}

Assistant:

int beagleUpdatePrePartials(const int instance,
                            const BeagleOperation* operations,
                            int operationCount,
                            int cumulativeScalingIndex){
    DEBUG_START_TIME();
    beagle::BeagleImpl* beagleInstance = beagle::getBeagleInstance(instance);
    if (beagleInstance == NULL)
        return BEAGLE_ERROR_UNINITIALIZED_INSTANCE;
    int returnValue = beagleInstance->updatePrePartials((const int *) operations, operationCount,
                                                        cumulativeScalingIndex);
    DEBUG_END_TIME();
    return returnValue;
}